

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void memjrnlFreeChunks(MemJournal *p)

{
  FileChunk *pFVar1;
  FileChunk *p_00;
  
  p_00 = p->pFirst;
  while (p_00 != (FileChunk *)0x0) {
    pFVar1 = p_00->pNext;
    sqlite3_free(p_00);
    p_00 = pFVar1;
  }
  p->pFirst = (FileChunk *)0x0;
  return;
}

Assistant:

static void memjrnlFreeChunks(MemJournal *p){
  FileChunk *pIter;
  FileChunk *pNext;
  for(pIter=p->pFirst; pIter; pIter=pNext){
    pNext = pIter->pNext;
    sqlite3_free(pIter);
  } 
  p->pFirst = 0;
}